

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

string * __thiscall
pbrt::PMJ02BNSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,PMJ02BNSampler *this)

{
  vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_> **unaff_RBX;
  
  StringPrintf<pbrt::Point2<int>const&,int_const&,int_const&,int_const&,int_const&,pstd::vector<pbrt::Point2<float>,pstd::pmr::polymorphic_allocator<pbrt::Point2<float>>>*const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ PMJ02BNSampler pixel: %s sampleIndex: %d dimension: %d samplesPerPixel: %d pixelTileSize: %d pixelSamples: %p ]"
             ,(char *)&this->pixel,(Point2<int> *)&this->sampleIndex,&this->dimension,
             &this->samplesPerPixel,&this->pixelTileSize,(int *)&this->pixelSamples,unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string PMJ02BNSampler::ToString() const {
    return StringPrintf("[ PMJ02BNSampler pixel: %s sampleIndex: %d dimension: %d "
                        "samplesPerPixel: %d pixelTileSize: %d pixelSamples: %p ]",
                        pixel, sampleIndex, dimension, samplesPerPixel, pixelTileSize,
                        pixelSamples);
}